

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X_hufOnly_wksp
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int flags)

{
  U32 UVar1;
  size_t sVar2;
  size_t sStack_50;
  
  if (dstSize == 0) {
    sStack_50 = 0xffffffffffffffba;
  }
  else if (cSrcSize == 0) {
    sStack_50 = 0xffffffffffffffec;
  }
  else {
    UVar1 = HUF_selectDecoder(dstSize,cSrcSize);
    if (UVar1 == 0) {
      sVar2 = HUF_readDTableX1_wksp(dctx,cSrc,cSrcSize,workSpace,wkspSize,flags);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      if (sVar2 <= cSrcSize && cSrcSize - sVar2 != 0) {
        sVar2 = HUF_decompress4X1_usingDTable_internal
                          (dst,dstSize,(void *)((long)cSrc + sVar2),cSrcSize - sVar2,dctx,flags);
        return sVar2;
      }
    }
    else {
      sVar2 = HUF_readDTableX2_wksp(dctx,cSrc,cSrcSize,workSpace,wkspSize,flags);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
      if (sVar2 <= cSrcSize && cSrcSize - sVar2 != 0) {
        sVar2 = HUF_decompress4X2_usingDTable_internal
                          (dst,dstSize,(void *)((long)cSrc + sVar2),cSrcSize - sVar2,dctx,flags);
        return sVar2;
      }
    }
    sStack_50 = 0xffffffffffffffb8;
  }
  return sStack_50;
}

Assistant:

size_t HUF_decompress4X_hufOnly_wksp(HUF_DTable* dctx, void* dst, size_t dstSize, const void* cSrc, size_t cSrcSize, void* workSpace, size_t wkspSize, int flags)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize == 0) return ERROR(corruption_detected);

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
#if defined(HUF_FORCE_DECOMPRESS_X1)
        (void)algoNb;
        assert(algoNb == 0);
        return HUF_decompress4X1_DCtx_wksp(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
        (void)algoNb;
        assert(algoNb == 1);
        return HUF_decompress4X2_DCtx_wksp(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, flags);
#else
        return algoNb ? HUF_decompress4X2_DCtx_wksp(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, flags) :
                        HUF_decompress4X1_DCtx_wksp(dctx, dst, dstSize, cSrc, cSrcSize, workSpace, wkspSize, flags);
#endif
    }
}